

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_type_createMemberReferenceType(sysbvm_context_t *context,sysbvm_tuple_t baseType)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t local_28;
  sysbvm_object_tuple_t *local_20;
  
  sVar1 = (context->roots).memberAddressSpaceType;
  local_20 = *(sysbvm_object_tuple_t **)(sVar1 + 0x78);
  if (local_20 == (sysbvm_object_tuple_t *)0x0) {
    local_20 = sysbvm_context_allocatePointerTuple(context,sVar1,0);
    *(sysbvm_object_tuple_t **)(sVar1 + 0x78) = local_20;
  }
  local_28 = baseType;
  sVar1 = sysbvm_function_apply(context,(context->roots).referenceTypeTemplate,2,&local_28,0);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createMemberReferenceType(sysbvm_context_t *context, sysbvm_tuple_t baseType)
{
    return sysbvm_type_createReferenceType(context, baseType, sysbvm_memberAddressSpace_uniqueInstance(context));
}